

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

string * __thiscall
punky::obj::inspect_abi_cxx11_(string *__return_storage_ptr__,obj *this,Object *obj)

{
  variant_alternative_t<2UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  vVar1;
  uint uVar2;
  pointer pcVar3;
  uint __val;
  uint uVar4;
  variant_alternative_t<4UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar5;
  variant_alternative_t<2UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar6;
  undefined4 *puVar7;
  uint *puVar8;
  variant_alternative_t<5UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar9;
  uint uVar10;
  Object *obj_00;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  uint __len;
  any local_68;
  anon_class_8_1_a78179b7_conflict local_58;
  undefined4 local_50 [2];
  _Move_ctor_base<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  local_48;
  
  switch(*(undefined4 *)this) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "null";
    pcVar11 = "";
    break;
  case 1:
    puVar8 = (uint *)std::
                     get<1ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                               ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                                 *)(this + 8));
    uVar2 = *puVar8;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar12 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar10 = (uint)uVar12;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_00111ef2;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_00111ef2;
        }
        if (uVar10 < 10000) goto LAB_00111ef2;
        uVar12 = uVar12 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_00111ef2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar2 >> 0x1f),__len,__val);
    return __return_storage_ptr__;
  case 2:
    pvVar6 = std::
             get<2ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    vVar1 = *pvVar6;
    pcVar13 = "false";
    if ((ulong)vVar1 != 0) {
      pcVar13 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = pcVar13 + ((ulong)vVar1 ^ 5);
    break;
  case 3:
    local_68._M_manager = std::any::_Manager_external<punky::obj::Object>::_S_manage;
    local_68._M_storage._M_ptr = (void *)0x0;
    std::any::_Manager_external<punky::obj::Object>::_S_create<punky::obj::Object_const&>
              (&local_68._M_storage,(Object *)this);
    puVar7 = (undefined4 *)std::__any_caster<punky::obj::Object>(&local_68);
    if (puVar7 == (undefined4 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_50[0] = *puVar7;
    local_48.
    super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
    .
    super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
    ._M_index = *(__index_type *)(puVar7 + 10);
    local_58.__lhs = &local_48;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>_&&>
      ::_S_vtable._M_arr
      [local_48.
       super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
       .
       super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
       ._M_index]._M_data)
              (&local_58,
               (variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                *)(puVar7 + 2));
    inspect_abi_cxx11_(__return_storage_ptr__,(obj *)local_50,obj_00);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>_&>
      ::_S_vtable._M_arr
      [local_48.
       super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
       .
       super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
       ._M_index]._M_data)
              ((anon_class_1_0_00000001 *)&local_58,
               (variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                *)&local_48);
    local_48.
    super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
    .
    super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
    ._M_index = 0xff;
    if (local_68._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      return __return_storage_ptr__;
    }
    (*local_68._M_manager)(_Op_destroy,&local_68,(_Arg *)0x0);
    return __return_storage_ptr__;
  case 4:
    pvVar5 = std::
             get<4ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pvVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + pvVar5->_M_string_length);
    return __return_storage_ptr__;
  case 5:
    pvVar9 = std::
             get<5ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    (*(pvVar9->m_fn->super_ExprNode).super_AstNode._vptr_AstNode[3])(__return_storage_ptr__);
    return __return_storage_ptr__;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "";
    pcVar13 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "Default";
    pcVar11 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar13,pcVar11);
  return __return_storage_ptr__;
}

Assistant:

std::string inspect(const Object& obj)
{
    switch (obj.m_type)
    {
        case ObjectType::Int:
            return std::to_string(std::get<int>(obj.m_value));

        case ObjectType::Boolean:
            return std::get<bool>(obj.m_value) ? "true" : "false";

        case ObjectType::Return:
            return inspect(std::any_cast<Object>(obj));

        case ObjectType::Error:
            return std::get<std::string>(obj.m_value);

        case ObjectType::Function:
            return std::get<FunctionObject>(obj.m_value).fn()->to_string();

        case ObjectType::EmptyOut:
            return "";

        case ObjectType::Null:
            return "null";

        default:
            return "Default";
    }
}